

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwidget.cpp
# Opt level: O1

void __thiscall QOpenGLWidgetPrivate::beginCompose(QOpenGLWidgetPrivate *this)

{
  QObject *this_00;
  
  this_00 = *(QObject **)&this->field_0x8;
  if (this->flushPending == true) {
    this->flushPending = false;
    QOpenGLWidget::makeCurrent((QOpenGLWidget *)this_00);
    QOpenGLContext::functions();
    QOpenGLExtensions::flushShared();
  }
  this->hasBeenComposed = true;
  QMetaObject::activate(this_00,&QOpenGLWidget::staticMetaObject,0,(void **)0x0);
  return;
}

Assistant:

void QOpenGLWidgetPrivate::beginCompose()
{
    Q_Q(QOpenGLWidget);
    if (flushPending) {
        flushPending = false;
        q->makeCurrent();
        static_cast<QOpenGLExtensions *>(context->functions())->flushShared();
    }
    hasBeenComposed = true;
    emit q->aboutToCompose();
}